

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void tchecker::clockbounds::fill_local_m_map(local_m_map_t *param_1,local_lu_map_t *param_2)

{
  uint uVar1;
  invalid_argument *this;
  ulong uVar2;
  
  if (param_1->_clock_nb == param_2->_clock_nb) {
    uVar1 = param_1->_loc_nb;
    if (uVar1 == param_2->_loc_nb) {
      if ((ulong)uVar1 != 0) {
        uVar2 = 0;
        do {
          if (param_1->_loc_nb <= uVar2) {
LAB_001c6f41:
            __assert_fail("id < _loc_nb",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                          ,0x1bc,
                          "tchecker::clockbounds::map_t &tchecker::clockbounds::local_m_map_t::M(tchecker::loc_id_t)"
                         );
          }
          if (param_2->_loc_nb <= uVar2) {
            __assert_fail("id < _loc_nb",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                          ,0xc0,
                          "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::L(tchecker::loc_id_t) const"
                         );
          }
          copy((EVP_PKEY_CTX *)
               (param_1->_M).
               super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2],
               (EVP_PKEY_CTX *)
               (param_2->_L).
               super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2]);
          if (param_1->_loc_nb <= uVar2) goto LAB_001c6f41;
          if (param_2->_loc_nb <= uVar2) {
            __assert_fail("id < _loc_nb",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                          ,0xcc,
                          "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::U(tchecker::loc_id_t) const"
                         );
          }
          update((param_1->_M).
                 super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2],
                 (param_2->_U).
                 super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      return;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"*** fill_local_m_map: incompatible number of locations");
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"*** fill_local_m_map: incompatible number of clocks");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::clockbounds::map_t & local_m_map_t::M(tchecker::loc_id_t id)
{
  assert(id < _loc_nb);
  return *_M[id];
}